

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

mdns_string_pair_t *
mdns_get_next_substring
          (mdns_string_pair_t *__return_storage_ptr__,void *rawdata,size_t size,size_t offset)

{
  byte bVar1;
  int iVar2;
  size_t length;
  uint8_t *buffer;
  size_t offset_local;
  size_t size_local;
  void *rawdata_local;
  
  __return_storage_ptr__->offset = 0xffffffffffffffff;
  __return_storage_ptr__->length = 0;
  *(undefined8 *)&__return_storage_ptr__->ref = 0;
  if (*(char *)((long)rawdata + offset) == '\0') {
    __return_storage_ptr__->offset = offset;
  }
  else {
    iVar2 = mdns_is_string_ref(*(uint8_t *)((long)rawdata + offset));
    buffer = (uint8_t *)offset;
    if (iVar2 != 0) {
      if (size < offset + 2) {
        return __return_storage_ptr__;
      }
      buffer = (uint8_t *)
               (long)(int5)((uint5)CONCAT11(*(undefined1 *)((long)rawdata + offset),
                                            *(undefined1 *)((long)rawdata + offset + 1)) & 0x3fff);
      if (size <= buffer) {
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->ref = 1;
    }
    bVar1 = *(byte *)((long)rawdata + (long)buffer);
    if (buffer + 1 + bVar1 <= size) {
      __return_storage_ptr__->offset = (size_t)(buffer + 1);
      __return_storage_ptr__->length = (ulong)bVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mdns_string_pair_t
mdns_get_next_substring(const void* rawdata, size_t size, size_t offset) {
	const uint8_t* buffer = (const uint8_t*)rawdata;
	mdns_string_pair_t pair = {MDNS_INVALID_POS, 0, 0};
	if (!buffer[offset]) {
		pair.offset = offset;
		return pair;
	}
	if (mdns_is_string_ref(buffer[offset])) {
		if (size < offset + 2)
			return pair;

		offset = (((size_t)(0x3f & buffer[offset]) << 8) | (size_t)buffer[offset + 1]);
		if (offset >= size)
			return pair;

		pair.ref = 1;
	}

	size_t length = (size_t)buffer[offset++];
	if (size < offset + length)
		return pair;

	pair.offset = offset;
	pair.length = length;

	return pair;
}